

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

void __thiscall QAccessibleTableCell::selectCell(QAccessibleTableCell *this)

{
  char cVar1;
  SelectionMode SVar2;
  SelectionBehavior SVar3;
  undefined4 uVar4;
  long *plVar5;
  QItemSelectionModel *pQVar6;
  code *UNRECOVERED_JUMPTABLE;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x10))();
  if (cVar1 != '\0') {
    SVar2 = QAbstractItemView::selectionMode((QAbstractItemView *)(this->view).wp.value);
    if (SVar2 != NoSelection) {
      plVar5 = (long *)(**(code **)(*(long *)this + 0xe0))(this);
      plVar5 = (long *)(**(code **)(*plVar5 + 0xa0))(plVar5,5);
      SVar3 = QAbstractItemView::selectionBehavior((QAbstractItemView *)(this->view).wp.value);
      if (SVar3 == SelectRows) {
        if (plVar5 != (long *)0x0) {
          uVar4 = QPersistentModelIndex::row();
          UNRECOVERED_JUMPTABLE = *(code **)(*plVar5 + 0x88);
LAB_005328cd:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            (*UNRECOVERED_JUMPTABLE)
                      (plVar5,uVar4,*(long *)(in_FS_OFFSET + 0x28),UNRECOVERED_JUMPTABLE);
            return;
          }
          goto LAB_00532956;
        }
      }
      else if (SVar3 == SelectColumns) {
        if (plVar5 != (long *)0x0) {
          uVar4 = QPersistentModelIndex::column();
          UNRECOVERED_JUMPTABLE = *(code **)(*plVar5 + 0x90);
          goto LAB_005328cd;
        }
      }
      else {
        if (SVar2 == SingleSelection) {
          QAbstractItemView::clearSelection((QAbstractItemView *)(this->view).wp.value);
        }
        pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)(this->view).wp.value);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&this->m_index);
        (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,&local_40,2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00532956:
  __stack_chk_fail();
}

Assistant:

void QAccessibleTableCell::selectCell()
{
    if (!isValid())
        return;
    QAbstractItemView::SelectionMode selectionMode = view->selectionMode();
    if (selectionMode == QAbstractItemView::NoSelection)
        return;
    Q_ASSERT(table());
    QAccessibleTableInterface *cellTable = table()->tableInterface();

    switch (view->selectionBehavior()) {
    case QAbstractItemView::SelectItems:
        break;
    case QAbstractItemView::SelectColumns:
        if (cellTable)
            cellTable->selectColumn(m_index.column());
        return;
    case QAbstractItemView::SelectRows:
        if (cellTable)
            cellTable->selectRow(m_index.row());
        return;
    }

    if (selectionMode == QAbstractItemView::SingleSelection) {
        view->clearSelection();
    }

    view->selectionModel()->select(m_index, QItemSelectionModel::Select);
}